

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O0

Aig_Man_t * Nwk_ManStrash(Nwk_Man_t *pNtk)

{
  int iVar1;
  Aig_Man_t *p;
  char *pcVar2;
  Tim_Man_t *pTVar3;
  void *pvVar4;
  Vec_Ptr_t *p_00;
  Nwk_Obj_t *p_01;
  Nwk_Obj_t *pNVar5;
  Aig_Obj_t *pDriver;
  float fVar6;
  int local_34;
  int Level;
  int i;
  Nwk_Obj_t *pObj;
  Aig_Obj_t *pObjNew;
  Aig_Man_t *pMan;
  Vec_Ptr_t *vObjs;
  Nwk_Man_t *pNtk_local;
  
  iVar1 = Nwk_ManGetAigNodeNum(pNtk);
  p = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(pNtk->pName);
  p->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar2;
  pTVar3 = Tim_ManDup(pNtk->pManTime,1);
  p->pManTime = pTVar3;
  Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vObjs,local_34);
    if (pvVar4 != (void *)0x0) {
      *(undefined8 *)((long)pvVar4 + 0x10) = 0;
    }
  }
  p_00 = Nwk_ManDfs(pNtk);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= local_34) {
      Vec_PtrFree(p_00);
      Aig_ManCleanup(p);
      Aig_ManSetRegNum(p,0);
      return p;
    }
    p_01 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,local_34);
    iVar1 = Nwk_ObjIsCi(p_01);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsCo(p_01);
      if (iVar1 == 0) {
        iVar1 = Nwk_ObjIsNode(p_01);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkStrash.c"
                        ,0x86,"Aig_Man_t *Nwk_ManStrash(Nwk_Man_t *)");
        }
        pObj = (Nwk_Obj_t *)Nwk_ManStrashNode(p,p_01);
      }
      else {
        pNVar5 = Nwk_ObjFanin0(p_01);
        pDriver = Aig_NotCond((Aig_Obj_t *)pNVar5->pCopy,*(uint *)&p_01->field_0x20 >> 3 & 1);
        pObj = (Nwk_Obj_t *)Aig_ObjCreateCo(p,pDriver);
        iVar1 = Aig_ObjLevel((Aig_Obj_t *)pObj);
        Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,*(uint *)&p_01->field_0x20 >> 7,(float)iVar1);
      }
    }
    else {
      pObj = (Nwk_Obj_t *)Aig_ObjCreateCi(p);
      fVar6 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,*(uint *)&p_01->field_0x20 >> 7);
      Aig_ObjSetLevel((Aig_Obj_t *)pObj,(int)fVar6);
    }
    p_01->pCopy = pObj;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Nwk_ManStrash( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vObjs;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew = NULL;
    Nwk_Obj_t * pObj;
    int i, Level;
    pMan = Aig_ManStart( Nwk_ManGetAigNodeNum(pNtk) );
    pMan->pName = Abc_UtilStrsav( pNtk->pName );
    pMan->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    pMan->pManTime = Tim_ManDup( (Tim_Man_t *)pNtk->pManTime, 1 );
    Tim_ManIncrementTravId( (Tim_Man_t *)pMan->pManTime );
    Nwk_ManForEachObj( pNtk, pObj, i )
        pObj->pCopy = NULL;
//    Nwk_ManForEachObj( pNtk, pObj, i )
    vObjs = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vObjs, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi(pMan);
            Level = Tim_ManGetCiArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId );
            Aig_ObjSetLevel( pObjNew, Level );
        }
        else if ( Nwk_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pMan, Aig_NotCond((Aig_Obj_t *)Nwk_ObjFanin0(pObj)->pCopy, pObj->fInvert) );
            Level = Aig_ObjLevel( pObjNew );
            Tim_ManSetCoArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId, (float)Level );
        }
        else if ( Nwk_ObjIsNode(pObj) )
        {
            pObjNew = Nwk_ManStrashNode( pMan, pObj );
        }
        else
            assert( 0 );
        pObj->pCopy = pObjNew;
    }
    Vec_PtrFree( vObjs );
    Aig_ManCleanup( pMan );
    Aig_ManSetRegNum( pMan, 0 );
    return pMan;
}